

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdl_controller.cpp
# Opt level: O0

void __thiscall
r_exec::PrimaryMDLController::abduce_imdl
          (PrimaryMDLController *this,HLPBindingMap *bm,Fact *super_goal,Fact *f_imdl,bool opposite,
          double confidence,Sim *sim)

{
  int iVar1;
  Goal *this_00;
  Goal *pGVar2;
  Code *pCVar3;
  Fact *pFVar4;
  _GMonitor *m;
  _Fact *p_Var5;
  uint64_t deadline;
  ostream *poVar6;
  undefined4 extraout_var;
  ulong uVar7;
  long *plVar8;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  Fact *local_68;
  Fact *f_sub_goal;
  uint64_t now;
  Goal *local_48;
  Goal *sub_goal;
  Sim *sim_local;
  double confidence_local;
  _Fact *p_Stack_28;
  bool opposite_local;
  Fact *f_imdl_local;
  Fact *super_goal_local;
  HLPBindingMap *bm_local;
  PrimaryMDLController *this_local;
  
  sub_goal = (Goal *)sim;
  sim_local = (Sim *)confidence;
  confidence_local._7_1_ = opposite;
  p_Stack_28 = &f_imdl->super__Fact;
  f_imdl_local = super_goal;
  super_goal_local = (Fact *)bm;
  bm_local = (HLPBindingMap *)this;
  _Fact::set_cfd(&f_imdl->super__Fact,confidence);
  this_00 = (Goal *)operator_new(0x160);
  p_Var5 = p_Stack_28;
  pGVar2 = _Fact::get_goal(&f_imdl_local->super__Fact);
  pCVar3 = Goal::get_actor(pGVar2);
  Goal::Goal(this_00,p_Var5,pCVar3,1.0);
  pGVar2 = sub_goal;
  local_48 = this_00;
  core::P<r_exec::Sim>::operator=(&this_00->sim,(Sim *)sub_goal);
  f_sub_goal = (Fact *)(*Now)();
  pFVar4 = (Fact *)Fact::operator_new((Fact *)0x150,(size_t)pGVar2);
  Fact::Fact(pFVar4,(Code *)local_48,(uint64_t)f_sub_goal,(uint64_t)f_sub_goal,1.0,1.0);
  local_68 = pFVar4;
  m = (_GMonitor *)operator_new(200);
  pFVar4 = super_goal_local;
  pGVar2 = _Fact::get_goal(&f_imdl_local->super__Fact);
  p_Var5 = Goal::get_target(pGVar2);
  deadline = _Fact::get_before(p_Var5);
  RMonitor::RMonitor((RMonitor *)m,this,(BindingMap *)pFVar4,deadline,
                     (uint64_t)
                     (sub_goal->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                     super_LObject.super_Code.markers.cells.
                     super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_68,(Fact *)p_Stack_28);
  PMDLController::add_r_monitor(&this->super_PMDLController,m);
  PMDLController::inject_goal
            (&this->super_PMDLController,(HLPBindingMap *)super_goal_local,local_68,
             (Fact *)p_Stack_28);
  poVar6 = _Mem::Output(MDL_OUT);
  (*Now)();
  r_code::Utils::RelativeTime_abi_cxx11_((ulong)local_88);
  poVar6 = std::operator<<(poVar6,local_88);
  poVar6 = std::operator<<(poVar6," ");
  pCVar3 = Controller::getObject((Controller *)this);
  iVar1 = (*(pCVar3->super__Object)._vptr__Object[2])();
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,CONCAT44(extraout_var,iVar1));
  poVar6 = std::operator<<(poVar6," -> ");
  uVar7 = (**(code **)((long)(local_68->super__Fact).super_LObject.
                             super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code
                             .super__Object._vptr__Object + 0x10))();
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar7);
  poVar6 = std::operator<<(poVar6," goal imdl ");
  plVar8 = (long *)(**(code **)((long)(local_68->super__Fact).super_LObject.
                                      super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
                                      super_Code.super__Object._vptr__Object + 0x48))(local_68,0);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x48))(plVar8,0);
  uVar7 = (**(code **)(*plVar8 + 0x10))();
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar7);
  poVar6 = std::operator<<(poVar6,"[");
  p_Var5 = Goal::get_target(local_48);
  _Fact::get_after(p_Var5);
  r_code::Utils::RelativeTime_abi_cxx11_((ulong)local_a8);
  poVar6 = std::operator<<(poVar6,local_a8);
  poVar6 = std::operator<<(poVar6,",");
  p_Var5 = Goal::get_target(local_48);
  _Fact::get_before(p_Var5);
  r_code::Utils::RelativeTime_abi_cxx11_((ulong)local_c8);
  poVar6 = std::operator<<(poVar6,local_c8);
  std::operator<<(poVar6,"[\n");
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_88);
  return;
}

Assistant:

void PrimaryMDLController::abduce_imdl(HLPBindingMap *bm, Fact *super_goal, Fact *f_imdl, bool opposite, double confidence, Sim *sim)   // goal is f->g->f->object or f->g->|f->object; called concurrently by redcue() and _GMonitor::update().
{
    f_imdl->set_cfd(confidence);
    Goal *sub_goal = new Goal(f_imdl, super_goal->get_goal()->get_actor(), 1);
    sub_goal->sim = sim;
    uint64_t now = Now();
    Fact *f_sub_goal = new Fact(sub_goal, now, now, 1, 1);
    add_r_monitor(new RMonitor(this, bm, super_goal->get_goal()->get_target()->get_before(), sim->thz, f_sub_goal, f_imdl)); // the monitor will wait until the deadline of the super-goal.
    inject_goal(bm, f_sub_goal, f_imdl);
    OUTPUT(MDL_OUT) << Utils::RelativeTime(Now()) << " " << getObject()->get_oid() << " -> " << f_sub_goal->get_oid() << " goal imdl " << f_sub_goal->get_reference(0)->get_reference(0)->get_oid() << "[" << Utils::RelativeTime(sub_goal->get_target()->get_after()) << "," << Utils::RelativeTime(sub_goal->get_target()->get_before()) << "[\n";
}